

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_Constractor_bytedata_err_Test::TestBody
          (ConfidentialValue_Constractor_bytedata_err_Test *this)

{
  bool bVar1;
  ConfidentialValue value;
  string local_78;
  ConfidentialValue local_58;
  ByteData local_30;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"001122","");
    cfd::core::ByteData::ByteData(&local_30,&local_78);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_58,&local_30);
    if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    local_58._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_58);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x8d,
             "Expected: ConfidentialValue value(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
  if (((local_58._vptr_ConfidentialValue != (_func_int **)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_58._vptr_ConfidentialValue != (_func_int **)0x0)) {
    (**(code **)(*local_58._vptr_ConfidentialValue + 8))();
  }
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata_err) {
  // error
  EXPECT_THROW(ConfidentialValue value(ByteData("001122")), CfdException);
}